

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O2

locale __thiscall
booster::locale::impl_std::create_basic_parsing<wchar_t>
          (impl_std *this,locale *in,string *locale_name)

{
  numpunct_byname<wchar_t> *__f;
  moneypunct_byname<wchar_t,_true> *__f_00;
  moneypunct_byname<wchar_t,_false> *__f_01;
  ctype_byname<wchar_t> *__f_02;
  locale lStack_28;
  
  __f = (numpunct_byname<wchar_t> *)operator_new(0x18);
  std::__cxx11::numpunct_byname<wchar_t>::numpunct_byname
            ((char *)__f,(ulong)(locale_name->_M_dataplus)._M_p);
  std::locale::locale<std::__cxx11::numpunct_byname<wchar_t>>((locale *)this,in,__f);
  __f_00 = (moneypunct_byname<wchar_t,_true> *)operator_new(0x18);
  std::__cxx11::moneypunct_byname<wchar_t,true>::moneypunct_byname
            ((char *)__f_00,(ulong)(locale_name->_M_dataplus)._M_p);
  std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,true>>
            (&lStack_28,(locale *)this,__f_00);
  std::locale::operator=((locale *)this,&lStack_28);
  std::locale::~locale(&lStack_28);
  __f_01 = (moneypunct_byname<wchar_t,_false> *)operator_new(0x18);
  std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname
            ((char *)__f_01,(ulong)(locale_name->_M_dataplus)._M_p);
  std::locale::locale<std::__cxx11::moneypunct_byname<wchar_t,false>>
            (&lStack_28,(locale *)this,__f_01);
  std::locale::operator=((locale *)this,&lStack_28);
  std::locale::~locale(&lStack_28);
  __f_02 = (ctype_byname<wchar_t> *)operator_new(0x540);
  std::ctype_byname<wchar_t>::ctype_byname((char *)__f_02,(ulong)(locale_name->_M_dataplus)._M_p);
  std::locale::locale<std::ctype_byname<wchar_t>>(&lStack_28,(locale *)this,__f_02);
  std::locale::operator=((locale *)this,&lStack_28);
  std::locale::~locale(&lStack_28);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_basic_parsing(std::locale const &in,std::string const &locale_name)
{
    std::locale tmp = std::locale(in,new std::numpunct_byname<CharType>(locale_name.c_str()));
    tmp = std::locale(tmp,new std::moneypunct_byname<CharType,true>(locale_name.c_str()));
    tmp = std::locale(tmp,new std::moneypunct_byname<CharType,false>(locale_name.c_str()));
    tmp = std::locale(tmp,new std::ctype_byname<CharType>(locale_name.c_str()));
    return tmp;
}